

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall
Scine::Core::Log::Domain::printf<char_const(&)[6],int>(Domain *this,char (*args) [6],int *args_1)

{
  int iVar1;
  char *__s;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = snprintf((char *)0x0,0,*args,(ulong)(uint)*args_1);
  __s = (char *)operator_new__((long)(iVar1 + 1));
  snprintf(__s,(long)(iVar1 + 1),*args,(ulong)(uint)*args_1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  operator<<(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  operator_delete__(__s);
  return;
}

Assistant:

inline void printf(Args&&... args) {
      const int sz = snprintf(NULL, 0, std::forward<Args>(args)...);
      char* buf = new char[sz + 1];
      snprintf(buf, sz + 1, std::forward<Args>(args)...);
      (*this) << std::string(buf);
      delete[] buf;
    }